

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets(cmGlobalGenerator *this,AutogensType *autogens)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer ppcVar5;
  cmTarget *this_00;
  bool bVar6;
  __node_base *p_Var7;
  ulong uVar8;
  pointer name;
  byte bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetNames;
  cmQtAutoGenerators autogen;
  string local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b38;
  string local_b20;
  vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
  *local_b00;
  cmGlobalGenerator *local_af8;
  pair<cmQtAutoGenerators,_const_cmTarget_*> local_af0;
  cmQtAutoGenerators local_758;
  cmQtAutoGenerators local_3c8;
  cmTarget *local_38;
  
  ppcVar5 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar5) {
    uVar8 = 0;
    local_b00 = (vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
                 *)autogens;
    local_af8 = this;
    do {
      pcVar1 = ppcVar5[uVar8]->Makefile;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_b38,(pcVar1->Targets)._M_h._M_element_count);
      p_Var7 = &(pcVar1->Targets)._M_h._M_before_begin;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_b38,(value_type *)(p_Var7 + 0x3a));
      }
      name = local_b38.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_b38.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b38.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          this_00 = cmMakefile::FindTarget
                              ((this->LocalGenerators).
                               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar8]->Makefile,name,true)
          ;
          if (this_00->TargetTypeValue < UTILITY) {
            local_af0.first.QtMajorVersion._M_dataplus._M_p =
                 (pointer)&local_af0.first.QtMajorVersion.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"AUTOMOC","");
            bVar2 = cmTarget::GetPropertyAsBool(this_00,(string *)&local_af0);
            if (bVar2) {
LAB_002a1a4a:
              bVar3 = false;
LAB_002a1a4d:
              bVar6 = !bVar2;
              bVar9 = this_00->IsImportedTarget ^ 1;
            }
            else {
              local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"AUTOUIC","");
              bVar3 = cmTarget::GetPropertyAsBool(this_00,&local_b58);
              if (bVar3) goto LAB_002a1a4a;
              local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"AUTORCC","");
              bVar4 = cmTarget::GetPropertyAsBool(this_00,&local_b20);
              bVar6 = true;
              bVar3 = bVar6;
              if (bVar4) goto LAB_002a1a4d;
              bVar9 = 0;
              bVar3 = true;
            }
            if ((bVar3) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b20._M_dataplus._M_p != &local_b20.field_2)) {
              operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1
                             );
            }
            if ((bVar6) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b58._M_dataplus._M_p != &local_b58.field_2)) {
              operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_af0.first.QtMajorVersion._M_dataplus._M_p !=
                &local_af0.first.QtMajorVersion.field_2) {
              operator_delete(local_af0.first.QtMajorVersion._M_dataplus._M_p,
                              local_af0.first.QtMajorVersion.field_2._M_allocated_capacity + 1);
            }
            this = local_af8;
            if (bVar9 != 0) {
              cmQtAutoGenerators::cmQtAutoGenerators(&local_758);
              bVar2 = cmQtAutoGenerators::InitializeAutogenTarget(&local_758,this_00);
              if (bVar2) {
                cmQtAutoGenerators::cmQtAutoGenerators(&local_3c8,&local_758);
                local_38 = this_00;
                cmQtAutoGenerators::cmQtAutoGenerators(&local_af0.first,&local_3c8);
                local_af0.second = local_38;
                std::
                vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
                ::emplace_back<std::pair<cmQtAutoGenerators,cmTarget_const*>>(local_b00,&local_af0);
                cmQtAutoGenerators::~cmQtAutoGenerators(&local_af0.first);
                cmQtAutoGenerators::~cmQtAutoGenerators(&local_3c8);
              }
              cmQtAutoGenerators::~cmQtAutoGenerators(&local_758);
            }
          }
          name = name + 1;
        } while (name != local_b38.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b38);
      uVar8 = (ulong)((int)uVar8 + 1);
      ppcVar5 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3))
    ;
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateQtAutoGeneratorsTargets(AutogensType &autogens)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmTargets& targets =
      this->LocalGenerators[i]->GetMakefile()->GetTargets();
    std::vector<std::string> targetNames;
    targetNames.reserve(targets.size());
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      targetNames.push_back(ti->second.GetName());
      }
    for(std::vector<std::string>::iterator ti = targetNames.begin();
        ti != targetNames.end(); ++ti)
      {
      cmTarget& target = *this->LocalGenerators[i]
                              ->GetMakefile()->FindTarget(*ti, true);
      if(target.GetType() == cmTarget::EXECUTABLE ||
         target.GetType() == cmTarget::STATIC_LIBRARY ||
         target.GetType() == cmTarget::SHARED_LIBRARY ||
         target.GetType() == cmTarget::MODULE_LIBRARY ||
         target.GetType() == cmTarget::OBJECT_LIBRARY)
        {
        if((target.GetPropertyAsBool("AUTOMOC")
              || target.GetPropertyAsBool("AUTOUIC")
              || target.GetPropertyAsBool("AUTORCC"))
            && !target.IsImported())
          {
          cmQtAutoGenerators autogen;
          if(autogen.InitializeAutogenTarget(&target))
            {
            autogens.push_back(std::make_pair(autogen, &target));
            }
          }
        }
      }
    }
#else
  (void)autogens;
#endif
}